

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  byte bVar1;
  bool bVar2;
  HUF_CElt *__src;
  HUF_repeat HVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t _var_err__;
  BYTE *pBVar9;
  HUF_CElt *pHVar10;
  uint maxSymbolValue_local;
  HUF_CElt *local_48;
  BYTE *local_40;
  ulong local_38;
  
  if (((ulong)workSpace & 3) != 0) {
    return 0xffffffffffffffff;
  }
  if (wkspSize < 0x1800) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_40 = (BYTE *)((long)dst + dstSize);
  uVar4 = 0xb;
  if (huffLog != 0) {
    uVar4 = huffLog;
  }
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat == HUF_repeat_valid)) {
    sVar5 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_40,src,srcSize,nbStreams,oldHufTable,bmi2);
    return sVar5;
  }
  local_38 = CONCAT71(local_38._1_7_,repeat == (HUF_repeat *)0x0 || preferRepeat == 0);
  local_48 = (HUF_CElt *)CONCAT44(local_48._4_4_,uVar4);
  sVar5 = HIST_count_wksp((uint *)workSpace,&maxSymbolValue_local,src,srcSize,workSpace,wkspSize);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (sVar5 == srcSize) {
    *(undefined1 *)dst = *src;
    return 1;
  }
  if (sVar5 <= (srcSize >> 7) + 4) {
    return 0;
  }
  pBVar9 = (BYTE *)dst;
  pHVar10 = oldHufTable;
  if (repeat != (HUF_repeat *)0x0) {
    HVar3 = *repeat;
    if (HVar3 == HUF_repeat_check) {
      HVar3 = HUF_repeat_check;
      if (-1 < (int)maxSymbolValue_local) {
        lVar7 = 0;
        bVar2 = false;
        do {
          bVar2 = (bool)(bVar2 | (oldHufTable[lVar7].nbBits == '\0' &&
                                 *(int *)((long)workSpace + lVar7 * 4) != 0));
          lVar7 = lVar7 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar7);
        if (bVar2) {
          *repeat = HUF_repeat_none;
          goto LAB_001387f5;
        }
      }
    }
    bVar1 = (byte)local_38 | HVar3 == HUF_repeat_none;
    local_38 = CONCAT71(local_38._1_7_,bVar1);
    if (bVar1 == 0) goto LAB_0013898f;
  }
LAB_001387f5:
  uVar4 = FSE_optimalTableLog_internal((uint)local_48,srcSize,maxSymbolValue_local,1);
  local_48 = (HUF_CElt *)((long)workSpace + 0x400);
  sVar5 = HUF_buildCTable_wksp
                    (local_48,(uint *)workSpace,maxSymbolValue_local,uVar4,
                     (void *)((long)workSpace + 0x800),0x1000);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  local_38 = (ulong)maxSymbolValue_local;
  memset(local_48 + (maxSymbolValue_local + 1),0,(ulong)(maxSymbolValue_local + 1) * -4 + 0x400);
  __src = local_48;
  sVar5 = HUF_writeCTable(dst,dstSize,local_48,(uint)local_38,(uint)sVar5);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar5 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat == HUF_repeat_none) {
      if (srcSize <= sVar5 + 0xc) {
        return 0;
      }
    }
    else {
      if ((int)maxSymbolValue_local < 0) goto LAB_0013898f;
      lVar7 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + (uint)oldHufTable[lVar7].nbBits * *(int *)((long)workSpace + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while ((ulong)maxSymbolValue_local + 1 != lVar7);
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 + (uint)*(byte *)((long)workSpace + lVar7 * 4 + 0x402) *
                        *(int *)((long)workSpace + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while ((ulong)maxSymbolValue_local + 1 != lVar7);
      if ((srcSize <= sVar5 + 0xc) || (uVar6 >> 3 <= (uVar8 >> 3) + sVar5)) goto LAB_0013898f;
    }
    *repeat = HUF_repeat_none;
  }
  pBVar9 = (BYTE *)(sVar5 + (long)dst);
  pHVar10 = __src;
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,__src,0x400);
  }
LAB_0013898f:
  sVar5 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar9,local_40,src,srcSize,nbStreams,pHVar10,bmi2);
  return sVar5;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                 const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < HUF_WORKSPACE_SIZE) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, workSpace, wkspSize) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            table->nodeTable, sizeof(table->nodeTable));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, bmi2);
}